

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O2

void crc_init(void)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  crc_table[0] = 0;
  crc_table[1] = 0x864cfb;
  for (lVar3 = 1; (int)lVar3 != 0x80; lVar3 = lVar3 + 1) {
    uVar2 = crc_table[lVar3] * 2;
    uVar1 = uVar2 ^ 0x864cfb;
    if ((crc_table[lVar3] >> 0x17 & 1) != 0) {
      uVar1 = uVar2;
      uVar2 = uVar2 ^ 0x864cfb;
    }
    crc_table[lVar3 * 2] = uVar2;
    crc_table[lVar3 * 2 + 1] = uVar1;
  }
  return;
}

Assistant:

void
crc_init(void)
{
	int i;
	unsigned int t, *p, *q;
	unsigned int poly = 0x864CFB;

	p = q = crc_table;
	*q++ = 0;
	*q++ = poly;

	for (i = 1; i < 128; i++) {
		t = *(++p);
		if (t & 0x800000) {
			t <<= 1;
			*q++ = t ^ poly;
			*q++ = t;
		}
		else {
			t <<= 1;
			*q++ = t;
			*q++ = t ^ poly;
		}
	}
}